

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O1

PClassActor * __thiscall AActor::GetBloodType(AActor *this,int type)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PClass *p;
  PClassActor *pPVar3;
  FName *zaname;
  FName local_14 [3];
  
  if (type == 2) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar1);
    }
    uVar2 = *(uint *)((long)&(this->super_DThinker).super_DObject.Class[1].SpecialInits.Array + 4);
    zaname = local_14 + 2;
  }
  else if (type == 1) {
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar1);
    }
    uVar2 = *(uint *)&(this->super_DThinker).super_DObject.Class[1].SpecialInits.Array;
    zaname = local_14 + 1;
  }
  else {
    if (type != 0) {
      return (PClassActor *)0x0;
    }
    if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar1);
    }
    uVar2 = (this->super_DThinker).super_DObject.Class[1].super_PStruct.Fields.Count;
    zaname = local_14;
  }
  zaname->Index = uVar2;
  p = PClass::FindClass(zaname);
  pPVar3 = dyn_cast<PClassActor>((DObject *)p);
  if (pPVar3 == (PClassActor *)0x0) {
    return (PClassActor *)0x0;
  }
  pPVar3 = PClassActor::GetReplacement(pPVar3,true);
  return pPVar3;
}

Assistant:

PClassActor *GetBloodType(int type = 0) const
	{
		PClassActor *bloodcls;
		if (type == 0)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType);
		}
		else if (type == 1)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType2);
		}
		else if (type == 2)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType3);
		}
		else
		{
			return NULL;
		}

		if (bloodcls != NULL)
		{
			bloodcls = bloodcls->GetReplacement();
		}
		return bloodcls;
	}